

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O3

uint lodepng::isSRGB(LodePNGInfo *info)

{
  if ((info != (LodePNGInfo *)0x0) &&
     ((info->iccp_defined != 0 ||
      ((info->srgb_defined == 0 &&
       ((info->gama_defined != 0 ||
        ((info->chrm_defined != 0 &&
         (((((info->chrm_white_x != 0x7a26 || (info->chrm_white_y != 0x8084)) ||
            (info->chrm_red_x != 64000)) ||
           ((info->chrm_red_y != 33000 || (info->chrm_green_x != 30000)))) ||
          ((info->chrm_green_y != 60000 ||
           ((info->chrm_blue_x != 15000 || (info->chrm_blue_y != 6000)))))))))))))))) {
    return 0;
  }
  return 1;
}

Assistant:

static unsigned isSRGB(const LodePNGInfo* info) {
  if(!info) return 1; /* the default is considered sRGB. */

  /* TODO: support some ICC profiles that represent sRGB too. Tricky due to
  possible slight deviations and many ways of representing its gamma function. */
  if(info->iccp_defined) return 0;

  if(info->srgb_defined) return 1;

  /* The gamma chunk is unable to represent sRGB's two-part gamma, so cannot
  be sRGB, even if it's the default 45455. */
  if(info->gama_defined) return 0;

  if(info->chrm_defined) {
    if(info->chrm_white_x != 31270 || info->chrm_white_y != 32900) return 0;
    if(info->chrm_red_x != 64000 || info->chrm_red_y != 33000) return 0;
    if(info->chrm_green_x != 30000 || info->chrm_green_y != 60000) return 0;
    if(info->chrm_blue_x != 15000 || info->chrm_blue_y != 6000) return 0;
  }

  return 1;
}